

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackOverflowQueryTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedbackOverflowQueryFunctionalBase::deinit
          (TransformFeedbackOverflowQueryFunctionalBase *this)

{
  ShaderProgram *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*((this->super_TransformFeedbackOverflowQueryBaseTest).super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar3 + 0x490))(1,&this->m_vao);
  (**(code **)(lVar3 + 0x458))(1,&this->m_overflow_query);
  bVar1 = canTestStreamOverflow(this);
  if ((bVar1) && (this->m_stream_overflow_query != (GLuint *)0x0)) {
    (**(code **)(lVar3 + 0x458))
              ((this->super_TransformFeedbackOverflowQueryBaseTest).m_max_vertex_streams);
    if (this->m_stream_overflow_query != (GLuint *)0x0) {
      operator_delete__(this->m_stream_overflow_query);
    }
  }
  this_00 = this->m_checker_program;
  if (this_00 != (ShaderProgram *)0x0) {
    glu::ShaderProgram::~ShaderProgram(this_00);
    operator_delete(this_00,0xd0);
  }
  (**(code **)(lVar3 + 0x1680))(0);
  (**(code **)(lVar3 + 0x448))(this->m_program);
  if (this->m_tf_buffer != (GLuint *)0x0) {
    (**(code **)(lVar3 + 0x438))(this->m_tf_buffer_count);
    if (this->m_tf_buffer != (GLuint *)0x0) {
      operator_delete__(this->m_tf_buffer);
    }
  }
  tcu::TestNode::deinit((TestNode *)this);
  return;
}

Assistant:

virtual void deinit()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		gl.deleteVertexArrays(1, &m_vao);

		gl.deleteQueries(1, &m_overflow_query);

		if (canTestStreamOverflow())
		{
			if (m_stream_overflow_query != NULL)
			{
				gl.deleteQueries(getMaxVertexStreams(), m_stream_overflow_query);

				delete[] m_stream_overflow_query;
			}
		}

		if (m_checker_program != NULL)
		{
			delete m_checker_program;
		}

		gl.useProgram(0);
		gl.deleteProgram(m_program);

		if (m_tf_buffer != NULL)
		{
			gl.deleteBuffers(m_tf_buffer_count, m_tf_buffer);

			delete[] m_tf_buffer;
		}

		TransformFeedbackOverflowQueryBaseTest::deinit();
	}